

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O2

void __thiscall
Simplification_distributive2_Test::~Simplification_distributive2_Test
          (Simplification_distributive2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Simplification, distributive2)
{
    auto const n2 = 2_i;
    auto const x = symbol("x");
    auto const y = symbol("y");
    auto const f3o2 = fraction(3, 2);
    auto const e1 = n2 * x;
    auto const e = n2 * x + y + f3o2 * x;
    EXPECT_EQ(toString(e), "(+ (* 7/2 x) y)");
}